

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::tracker_response
          (torrent *this,tracker_request *r,address *tracker_ip,
          list<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *tracker_ips,
          tracker_response *resp)

{
  int *piVar1;
  string *args_4;
  size_t *psVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  session_interface *psVar5;
  element_type *peVar6;
  size_type sVar7;
  pointer pcVar8;
  size_t sVar9;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  i2p_connection *piVar12;
  element_type *peVar13;
  pointer piVar14;
  pointer piVar15;
  peer_list *ppVar16;
  pointer piVar17;
  pointer piVar18;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  long *plVar23;
  bool bVar24;
  pex_flags_t flags;
  time_point32 now;
  int iVar25;
  uint uVar26;
  announce_entry *this_00;
  element_type *peVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _List_node_base *p_Var28;
  _List_node_base *p_Var29;
  torrent_peer *ptVar30;
  uint *puVar31;
  char *pcVar32;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  tracker_response *ptVar33;
  ulong uVar34;
  address *extraout_RDX;
  address *paVar35;
  address *extraout_RDX_00;
  address *addr;
  ipv4_peer_entry *i;
  undefined8 uVar36;
  pointer piVar37;
  pointer piVar38;
  torrent *this_01;
  ulong uVar39;
  uchar this_02 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  const_iterator __end3;
  pointer ppVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_9;
  pointer ppVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  string_view destination_00;
  string_view s2;
  span<const_char> s;
  string_view s1;
  protocol_version v;
  peer_entry p;
  string destination;
  torrent_state st_1;
  endpoint local_endpoint;
  string resolved_to;
  undefined1 local_6f1 [33];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6d0;
  allocator<char> local_6c1;
  pointer local_6c0;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [24];
  element_type *local_690;
  anon_union_16_3_a3f0114d_for___in6_u local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  ulong local_668;
  undefined8 local_660;
  i2p_connection *local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_648;
  undefined8 local_640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  undefined1 local_618 [16];
  undefined8 local_608;
  i2p_connection *local_600;
  undefined1 local_5f8 [8];
  undefined1 auStack_5f0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5b8;
  undefined8 uStack_5b0;
  undefined4 local_5a8;
  string local_5a0;
  undefined1 local_580 [16];
  undefined1 local_570 [24];
  anon_class_8_1_8991fb9c_for_m_handler local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  anon_union_16_3_a3f0114d_for___in6_u local_548;
  element_type *local_538;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  pointer local_4e8;
  pointer local_4d8;
  i2p_connection *local_4d0;
  __shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2> local_4c8;
  undefined1 local_4b8 [16];
  long *local_4a8 [2];
  long local_498 [2];
  error_code local_488;
  data_union local_478;
  undefined1 local_458 [32];
  undefined1 local_438 [16];
  undefined8 local_428;
  system_error_category *apsStack_420 [2];
  pointer local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [7];
  _Alloc_hider local_398;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_390;
  
  paVar35 = &resp->external_ip;
  apsStack_420[0] = (system_error_category *)0x0;
  local_438._0_8_ = (_List_node_base *)0x0;
  stack0xfffffffffffffbd0 = ZEXT816(0);
  ptVar33 = (tracker_response *)tracker_ips;
  local_6f1._1_8_ = resp;
  local_6f1._9_8_ = r;
  bVar24 = boost::asio::ip::operator!=(paVar35,(address *)local_438);
  if (!bVar24) goto LAB_003232a1;
  if (tracker_ip->type_ == ipv4) {
    bVar24 = (tracker_ip->ipv4_address_).addr_.s_addr == 0;
LAB_0032324b:
    if (bVar24) goto LAB_003232a1;
  }
  else if (((((((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0] == '\0') &&
              ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[1] == '\0')) &&
             ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[2] == '\0')) &&
            (((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[3] == '\0' &&
             ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[4] == '\0')))) &&
           ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[5] == '\0')) &&
          ((((((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[6] == '\0' &&
              ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[7] == '\0')) &&
             (((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[8] == '\0' &&
              ((((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[9] == '\0' &&
                ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[10] == '\0')) &&
               ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] == '\0')))))) &&
            (((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
             ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] == '\0')))) &&
           ((tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] == '\0')))) {
    bVar24 = (tracker_ip->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] == '\0';
    goto LAB_0032324b;
  }
  p_Var4 = (((listen_socket_handle *)(local_6f1._9_8_ + 0xe0))->m_sock).
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var4->_M_use_count != 0)
     ) {
    psVar5 = (this->super_torrent_hot_members).m_ses;
    listen_socket_handle::get_local_endpoint
              ((endpoint *)local_438,(listen_socket_handle *)(local_6f1._9_8_ + 0xe0));
    ptVar33 = (tracker_response *)0x8;
    (*(psVar5->super_session_logger)._vptr_session_logger[2])(psVar5,(endpoint *)local_438,paVar35);
  }
LAB_003232a1:
  local_6f1._25_8_ = paVar35;
  local_6c0 = (pointer)tracker_ip;
  now = time_now32();
  peVar6 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auVar42[0] = -((char)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems[0] ==
                (char)(peVar6->m_info_hash).v1.m_number._M_elems[0]);
  auVar42[1] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 1)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 1));
  auVar42[2] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 2)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 2));
  auVar42[3] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 3)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 3));
  auVar42[4] = -((char)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems[1] ==
                (char)(peVar6->m_info_hash).v1.m_number._M_elems[1]);
  auVar42[5] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 5)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 5));
  auVar42[6] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 6)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 6));
  auVar42[7] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 7)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 7));
  auVar42[8] = -((char)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems[2] ==
                (char)(peVar6->m_info_hash).v1.m_number._M_elems[2]);
  auVar42[9] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 9)
                == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 9));
  auVar42[10] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems + 10)
                 == *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 10));
  auVar42[0xb] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems +
                            0xb) ==
                  *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 0xb));
  auVar42[0xc] = -((char)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems[3] ==
                  (char)(peVar6->m_info_hash).v1.m_number._M_elems[3]);
  auVar42[0xd] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems +
                            0xd) ==
                  *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 0xd));
  auVar42[0xe] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems +
                            0xe) ==
                  *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 0xe));
  auVar42[0xf] = -(*(char *)((long)(((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems +
                            0xf) ==
                  *(char *)((long)(peVar6->m_info_hash).v1.m_number._M_elems + 0xf));
  uVar26 = (peVar6->m_info_hash).v1.m_number._M_elems[4];
  uVar3 = (((sha1_hash *)(local_6f1._9_8_ + 0xb8))->m_number)._M_elems[4];
  auVar44[0] = -((char)uVar3 == (char)uVar26);
  auVar44[1] = -((char)(uVar3 >> 8) == (char)(uVar26 >> 8));
  auVar44[2] = -((char)(uVar3 >> 0x10) == (char)(uVar26 >> 0x10));
  auVar44[3] = -((char)(uVar3 >> 0x18) == (char)(uVar26 >> 0x18));
  auVar44[4] = 0xff;
  auVar44[5] = 0xff;
  auVar44[6] = 0xff;
  auVar44[7] = 0xff;
  auVar44[8] = 0xff;
  auVar44[9] = 0xff;
  auVar44[10] = 0xff;
  auVar44[0xb] = 0xff;
  auVar44[0xc] = 0xff;
  auVar44[0xd] = 0xff;
  auVar44[0xe] = 0xff;
  auVar44[0xf] = 0xff;
  auVar44 = auVar44 & auVar42;
  local_6f1[0] = (ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) != 0xffff;
  this_00 = tracker_list::find_tracker(&this->m_trackers,(string *)local_6f1._9_8_);
  local_478._8_4_ = 0;
  local_478._12_4_ = 0;
  local_478._16_4_ = 0;
  local_478._20_8_ = 0;
  local_478._0_8_ = 2;
  local_6f1._17_8_ = this;
  if ((this_00 != (announce_entry *)0x0) &&
     (peVar27 = (element_type *)
                announce_entry::find_endpoint
                          (this_00,(listen_socket_handle *)(local_6f1._9_8_ + 0xe0)),
     peVar27 != (element_type *)0x0)) {
    uVar39 = (ulong)local_6f1[0];
    local_478._0_8_ = *(undefined8 *)&(((endpoint *)&peVar27->super_request_callback)->impl_).data_;
    _Var19._M_head_impl =
         (peVar27->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    local_478._20_8_ =
         *(undefined8 *)
          ((long)&(peVar27->super_torrent_hot_members).m_hash_picker._M_t.
                  super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                  .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl + 4);
    local_478._16_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)
                  ((long)&(peVar27->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl + 4) >> 0x20);
    local_478._8_4_ = SUB84(_Var19._M_head_impl,0);
    local_478._12_4_ = (undefined4)((ulong)_Var19._M_head_impl >> 0x20);
    if (-1 < *(int *)(local_6f1._1_8_ + 0xec)) {
      *(int *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -8) =
           *(int *)(local_6f1._1_8_ + 0xec);
    }
    if (-1 < *(int *)(local_6f1._1_8_ + 0xe8)) {
      *(int *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -4) =
           *(int *)(local_6f1._1_8_ + 0xe8);
    }
    if (-1 < *(int *)(local_6f1._1_8_ + 0xf4)) {
      *(int *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48) =
           *(int *)(local_6f1._1_8_ + 0xf4);
    }
    uVar26 = *(uint *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + 4);
    if (((uVar26 >> 8 & 1) == 0) && (*(event_t *)(local_6f1._9_8_ + 0x7a) == started)) {
      *(ushort *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + 4) =
           (ushort)uVar26 | 0x100;
    }
    uVar26 = *(uint *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + 4);
    if (((uVar26 >> 9 & 1) == 0) && (*(event_t *)(local_6f1._9_8_ + 0x7a) == completed)) {
      *(ushort *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + 4) =
           (ushort)uVar26 | 0x200;
      this->field_0x606 = this->field_0x606 | 0x40;
    }
    this_00->field_0x6e = this_00->field_0x6e | 0x10;
    *(rep_conflict *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -0x10) =
         ((seconds32 *)(local_6f1._1_8_ + 0xe0))->__r + (int)now.__d.__r;
    *(rep_conflict *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -0xc) =
         ((seconds32 *)(local_6f1._1_8_ + 0xe4))->__r + (int)now.__d.__r;
    *(undefined1 *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + 4) = 0;
    *(undefined4 *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -0x20) = 0;
    *(undefined1 *)((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -0x1c) = 0;
    *(system_error_category **)
     ((long)&peVar27->super_peer_class_set + (ulong)local_6f1[0] * 0x48 + -0x18) =
         &boost::system::detail::cat_holder<void>::system_category_instance;
    sVar7 = ((string *)(local_6f1._1_8_ + 0xc0))->_M_string_length;
    ptVar33 = (tracker_response *)local_6f1._1_8_;
    local_690 = peVar27;
    local_438._0_8_ = (_List_node_base *)&local_428;
    if (sVar7 == 0) {
      stack0xfffffffffffffbd0 = ZEXT89(0);
    }
    else {
      pcVar8 = (((string *)(local_6f1._1_8_ + 0xc0))->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>((string *)local_438,pcVar8,pcVar8 + sVar7);
    }
    ::std::__cxx11::string::_M_assign
              ((string *)((long)&peVar27->super_peer_class_set + uVar39 * 0x48 + -0x40));
    local_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_6d0._4_4_,now.__d.__r);
    if ((_List_node_base *)local_438._0_8_ != (_List_node_base *)&local_428) {
      operator_delete((void *)local_438._0_8_,local_428 + 1);
    }
    tracker_list::record_working(&this->m_trackers,this_00);
    this = (torrent *)local_6f1._17_8_;
    sVar9 = ((string *)(local_6f1._1_8_ + 0x80))->_M_string_length;
    if (sVar9 != 0) {
      args_4 = (string *)(local_6f1._1_8_ + 0x80);
      __n = (this_00->trackerid)._M_string_length;
      ptVar33 = (tracker_response *)local_6f1._1_8_;
      if ((__n != sVar9) ||
         ((__n != 0 &&
          (iVar25 = bcmp((this_00->trackerid)._M_dataplus._M_p,(args_4->_M_dataplus)._M_p,__n),
          iVar25 != 0)))) {
        ::std::__cxx11::string::_M_assign((string *)&this_00->trackerid);
        iVar25 = (*(((torrent_hot_members *)((long)this + 8))->m_ses->super_session_logger).
                   _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar25) + 0x68) & 0x40) != 0) {
          iVar25 = (*(((torrent_hot_members *)((long)this + 8))->m_ses->super_session_logger).
                     _vptr_session_logger[5])();
          get_handle((torrent *)local_438);
          ptVar33 = (tracker_response *)local_6f1;
          alert_manager::
          emplace_alert<libtorrent::trackerid_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::protocol_version_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((alert_manager *)CONCAT44(extraout_var_00,iVar25),(torrent_handle *)local_438,
                     (basic_endpoint<boost::asio::ip::tcp> *)local_690,(protocol_version *)ptVar33,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_6f1._9_8_,args_4);
          if ((long *)local_438._8_8_ != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar1 = (int *)(local_438._8_8_ + 0xc);
              iVar25 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
            }
            else {
              iVar25 = *(int *)(local_438._8_8_ + 0xc);
              ptVar33 = (tracker_response *)(ulong)(iVar25 - 1U);
              *(uint *)(local_438._8_8_ + 0xc) = iVar25 - 1U;
            }
            if (iVar25 == 1) {
              (**(code **)(*(long *)local_438._8_8_ + 0x18))();
            }
          }
        }
      }
    }
    update_scrape_state(this);
    now.__d.__r = (duration)(duration)local_6d0._0_4_;
  }
  update_tracker_timer(this,now);
  iVar25 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar25 != '\0') {
    local_438._0_8_ = &local_428;
    stack0xfffffffffffffbd0 = ZEXT89(0);
    paVar35 = extraout_RDX;
    p_Var28 = (_List_node_base *)tracker_ips;
    while (p_Var28 = (((_List_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                        *)&p_Var28->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var28 != (_List_node_base *)tracker_ips) {
      boost::asio::ip::address::to_string_abi_cxx11_((string *)local_580,(address *)(p_Var28 + 1));
      ::std::__cxx11::string::_M_append(local_438,local_580._0_8_);
      if ((undefined1 *)local_580._0_8_ != local_570) {
        operator_delete((void *)local_580._0_8_,local_570._0_8_ + 1);
      }
      ::std::__cxx11::string::append(local_438);
      paVar35 = extraout_RDX_00;
    }
    uVar26 = ((seconds32 *)(local_6f1._1_8_ + 0xe0))->__r;
    uVar3 = ((seconds32 *)(local_6f1._1_8_ + 0xe4))->__r;
    print_address_abi_cxx11_((string *)local_580,(aux *)local_6f1._25_8_,paVar35);
    uVar21 = local_438._0_8_;
    uVar36 = local_580._0_8_;
    print_address_abi_cxx11_((string *)&local_688,(aux *)local_6c0,addr);
    ptVar33 = (tracker_response *)(ulong)uVar3;
    (*((request_callback *)local_6f1._17_8_)->_vptr_request_callback[7])
              (local_6f1._17_8_,
               "TRACKER RESPONSE [ interval: %d | min-interval: %d | external ip: %s | resolved to: %s | we connected to: %s ]"
               ,(ulong)uVar26,ptVar33,uVar36,uVar21,local_688._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._0_8_ != &local_678) {
      operator_delete((void *)local_688._0_8_,local_678._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_580._0_8_ != local_570) {
      operator_delete((void *)local_580._0_8_,local_570._0_8_ + 1);
    }
    this = (torrent *)local_6f1._17_8_;
    if ((_List_node_base *)local_438._0_8_ != (_List_node_base *)&local_428) {
      operator_delete((void *)local_438._0_8_,local_428 + 1);
    }
  }
  ppVar40 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *)
             local_6f1._1_8_)->
            super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar41 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *)
             local_6f1._1_8_)->
            super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar40 != ppVar41) {
    local_6f1._25_8_ = &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
    local_6c0 = ppVar41;
    do {
      auVar43[0] = -((char)(ppVar40->pid).m_number._M_elems[0] ==
                    (char)(this->m_peer_id).m_number._M_elems[0]);
      auVar43[1] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 1) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 1));
      auVar43[2] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 2) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 2));
      auVar43[3] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 3) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 3));
      auVar43[4] = -((char)(ppVar40->pid).m_number._M_elems[1] ==
                    (char)(this->m_peer_id).m_number._M_elems[1]);
      auVar43[5] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 5) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 5));
      auVar43[6] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 6) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 6));
      auVar43[7] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 7) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 7));
      auVar43[8] = -((char)(ppVar40->pid).m_number._M_elems[2] ==
                    (char)(this->m_peer_id).m_number._M_elems[2]);
      auVar43[9] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 9) ==
                    *(char *)((long)(this->m_peer_id).m_number._M_elems + 9));
      auVar43[10] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 10) ==
                     *(char *)((long)(this->m_peer_id).m_number._M_elems + 10));
      auVar43[0xb] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 0xb) ==
                      *(char *)((long)(this->m_peer_id).m_number._M_elems + 0xb));
      auVar43[0xc] = -((char)(ppVar40->pid).m_number._M_elems[3] ==
                      (char)(this->m_peer_id).m_number._M_elems[3]);
      auVar43[0xd] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 0xd) ==
                      *(char *)((long)(this->m_peer_id).m_number._M_elems + 0xd));
      auVar43[0xe] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 0xe) ==
                      *(char *)((long)(this->m_peer_id).m_number._M_elems + 0xe));
      auVar43[0xf] = -(*(char *)((long)(ppVar40->pid).m_number._M_elems + 0xf) ==
                      *(char *)((long)(this->m_peer_id).m_number._M_elems + 0xf));
      uVar26 = (this->m_peer_id).m_number._M_elems[4];
      uVar3 = (ppVar40->pid).m_number._M_elems[4];
      auVar45[0] = -((char)uVar3 == (char)uVar26);
      auVar45[1] = -((char)(uVar3 >> 8) == (char)(uVar26 >> 8));
      auVar45[2] = -((char)(uVar3 >> 0x10) == (char)(uVar26 >> 0x10));
      auVar45[3] = -((char)(uVar3 >> 0x18) == (char)(uVar26 >> 0x18));
      auVar45[4] = 0xff;
      auVar45[5] = 0xff;
      auVar45[6] = 0xff;
      auVar45[7] = 0xff;
      auVar45[8] = 0xff;
      auVar45[9] = 0xff;
      auVar45[10] = 0xff;
      auVar45[0xb] = 0xff;
      auVar45[0xc] = 0xff;
      auVar45[0xd] = 0xff;
      auVar45[0xe] = 0xff;
      auVar45[0xf] = 0xff;
      auVar45 = auVar45 & auVar43;
      if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff) {
        if (*(i2p_connection **)(local_6f1._9_8_ + 0x100) == (i2p_connection *)0x0) {
          iVar25 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[8])();
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_580,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     local_6f1._25_8_);
          auVar42 = stack0xfffffffffffffbd0;
          local_438._0_8_ = on_peer_name_lookup;
          stack0xfffffffffffffbd0 = (unkuint10)CONCAT71(local_428._1_7_,local_6f1[0]) << 0x40;
          local_428._4_4_ = auVar42._12_4_;
          local_428._2_2_ = ppVar40->port;
          apsStack_420[0] = (system_error_category *)local_580._0_8_;
          apsStack_420[1] = (system_error_category *)local_580._8_8_;
          local_580._0_2_ = 0;
          local_580._2_2_ = 0;
          local_580._4_4_ = 0;
          local_580[8] = '\0';
          local_580[9] = '\0';
          local_580[10] = '\0';
          local_580[0xb] = '\0';
          local_580[0xc] = '\0';
          local_580[0xd] = '\0';
          local_580[0xe] = '\0';
          local_580[0xf] = '\0';
          ::std::
          function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
          ::
          function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short,libtorrent::protocol_version))(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,int,libtorrent::protocol_version)>,void>
                    ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                      *)local_458,
                     (_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short,_libtorrent::protocol_version))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int,_libtorrent::protocol_version)>
                      *)local_438);
          ptVar33 = (tracker_response *)local_458;
          (*(code *)**(undefined8 **)CONCAT44(extraout_var_01,iVar25))
                    ((undefined8 *)CONCAT44(extraout_var_01,iVar25),ppVar40,2);
          if ((pointer)local_458._16_8_ != (pointer)0x0) {
            (*(code *)local_458._16_8_)
                      ((tracker_response *)local_458,(tracker_response *)local_458,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apsStack_420[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apsStack_420[1]);
          }
          this_02 = (uchar  [8])local_580._8_8_;
        }
        else {
          s2._M_str = ".i2p";
          s2._M_len = 4;
          s1._M_str = (char *)(ppVar40->hostname)._M_dataplus._M_p;
          s1._M_len = (size_t)(ppVar40->hostname)._M_string_length;
          bVar24 = string_ends_with(s1,s2);
          if (!bVar24) {
            get_peer_list_state((torrent_state *)local_438,this);
            need_peer_list(this);
            ptVar33 = (tracker_response *)0x1;
            destination_00._M_str = (char *)(ppVar40->hostname)._M_dataplus._M_p;
            destination_00._M_len = (size_t)(ppVar40->hostname)._M_string_length;
            ptVar30 = peer_list::add_i2p_peer
                                ((this->super_torrent_hot_members).m_peer_list._M_t.
                                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                                 _M_head_impl,destination_00,(peer_source_flags_t)0x1,
                                 (pex_flags_t)0x0,(torrent_state *)local_438);
            if (ptVar30 != (torrent_peer *)0x0) {
              state_updated(this);
            }
            _Var22._M_p = local_398._M_p;
            uVar36 = local_408[6]._8_8_;
            if ((this->super_torrent_hot_members).m_picker._M_t.
                super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
                (piece_picker *)0x0) {
              for (; (pointer)uVar36 != _Var22._M_p;
                  uVar36 = &((element_type *)uVar36)->super_torrent_hot_members) {
                piece_picker::clear_peer
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,
                           (torrent_peer *)
                           (((element_type *)uVar36)->super_request_callback)._vptr_request_callback
                          );
              }
            }
            if ((element_type *)local_408[6]._8_8_ != (element_type *)0x0) {
              operator_delete((void *)local_408[6]._8_8_,(long)local_390._M_pi - local_408[6]._8_8_)
              ;
            }
            goto LAB_00323b72;
          }
          paVar10 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(local_6f1._9_8_ + 0x100);
          p_Var28 = (_List_node_base *)(ppVar40->hostname)._M_dataplus._M_p;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_6a8,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     local_6f1._25_8_);
          if (((((int)*(long *)*(undefined1 (*) [16])(paVar10->_M_local_buf + 0x90) == 2) &&
               (*(long **)(paVar10->_M_local_buf + 0x78) == (long *)(paVar10->_M_local_buf + 0x78)))
              && (paVar10->_M_allocated_capacity != 0)) &&
             (*(int *)(paVar10->_M_allocated_capacity + 8) != -1)) {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_600,(char *)p_Var28,(allocator<char> *)local_4a8);
            piVar12 = local_600;
            uVar36 = local_6a8._0_8_;
            local_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6a8._8_8_;
            local_6a8._0_16_ = (undefined1  [16])0x0;
            *(undefined4 *)*(undefined1 (*) [16])(paVar10->_M_local_buf + 0x90) = 1;
            sVar7 = paVar10->_M_allocated_capacity;
            pcVar32 = *(char **)(sVar7 + 0x140);
            strlen((char *)local_600);
            ::std::__cxx11::string::_M_replace(sVar7 + 0x138,0,pcVar32,(ulong)piVar12);
            p_Var20 = local_6d0;
            this = (torrent *)local_6f1._17_8_;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)paVar10->_M_allocated_capacity;
            p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)paVar10 + 8);
            local_628 = *paVar10;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            local_690 = (element_type *)uVar36;
            local_618._8_8_ = local_6d0;
            local_618._0_8_ = uVar36;
            paVar11->_M_local_buf[0x169] = '\x04';
            local_630 = paVar10;
            uVar26 = snprintf(local_438,0x400,"NAMING LOOKUP NAME=%s\n",
                              *(long *)(paVar11->_M_local_buf + 0x138));
            if (0x3ff < uVar26) {
              uVar26 = 0x400;
            }
            local_570._0_8_ = ZEXT48(uVar26);
            local_628 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )0x0;
            local_618 = (undefined1  [16])0x0;
            aStack_5c8._8_8_ = 0;
            p_Stack_5b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            stack0xfffffffffffffa30 = (undefined1  [16])0x0;
            local_580._8_8_ = local_438;
            local_580._0_8_ = paVar11;
            local_570._8_8_ = 0;
            local_570._16_4_ = 0;
            local_678._8_8_ = 0;
            local_678._M_allocated_capacity = 0;
            local_538 = local_690;
            local_660 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_530._M_pi = p_Var20;
            local_668 = 0;
            local_4d0 = (i2p_connection *)((ulong)local_4d0 & 0xffffff0000000000);
            local_4c8._M_ptr =
                 (element_type *)&boost::system::detail::cat_holder<void>::system_category_instance;
            ptVar33 = (tracker_response *)0x1;
            local_688._0_8_ = paVar11;
            local_688._8_8_ = paVar10;
            auStack_5f0._24_8_ = paVar10;
            local_558.this = (i2p_stream *)paVar11;
            local_550 = paVar10;
            local_548._0_8_ = paVar11;
            local_548._8_8_ = p_Var4;
            boost::asio::detail::
            write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>_>_>
            ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>_>_>
                          *)local_580,(error_code *)&local_4d0,0,1);
            ppVar41 = local_6c0;
            if (local_530._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._8_8_);
            }
            if (p_Stack_5b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_5b8);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_5c8._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_5c8._0_8_);
            }
            if (local_600 != (i2p_connection *)(local_5f8 + 8)) {
              operator_delete(local_600,auStack_5f0._0_8_ + 1);
            }
          }
          else {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_438,(char *)p_Var28,(allocator<char> *)local_580);
            p_Var28 = (_List_node_base *)operator_new(0x50);
            p_Var28[1]._M_next = p_Var28 + 2;
            if ((_List_node_base *)local_438._0_8_ == (_List_node_base *)&local_428) {
              p_Var28[2]._M_next = (_List_node_base *)local_428;
              p_Var28[2]._M_prev = (_List_node_base *)apsStack_420[0];
            }
            else {
              p_Var28[1]._M_next = (_List_node_base *)local_438._0_8_;
              p_Var28[2]._M_next = (_List_node_base *)local_428;
            }
            p_Var28[1]._M_prev = (_List_node_base *)local_438._8_8_;
            stack0xfffffffffffffbd0 = ZEXT89(0);
            p_Var28[4]._M_next = (_List_node_base *)0x0;
            p_Var28[4]._M_prev = (_List_node_base *)0x0;
            p_Var28[3]._M_next = (_List_node_base *)0x0;
            p_Var28[3]._M_prev = (_List_node_base *)0x0;
            local_438._0_8_ = (_List_node_base *)&local_428;
            p_Var29 = (_List_node_base *)operator_new(0x10);
            p_Var29->_M_next = (_List_node_base *)local_6a8._0_8_;
            p_Var29->_M_prev = (_List_node_base *)0x0;
            ptVar33 = (tracker_response *)local_6a8._8_8_;
            p_Var29->_M_prev = (_List_node_base *)local_6a8._8_8_;
            local_6a8._0_16_ = ZEXT816(0);
            p_Var28[3]._M_next = p_Var29;
            p_Var28[4]._M_prev =
                 (_List_node_base *)
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_invoke;
            p_Var28[4]._M_next =
                 (_List_node_base *)
                 ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
                 ::_M_manager;
            ::std::__detail::_List_node_base::_M_hook(p_Var28);
            *(long *)(paVar10->_M_local_buf + 0x88) = *(long *)(paVar10->_M_local_buf + 0x88) + 1;
            this = (torrent *)local_6f1._17_8_;
            ppVar41 = local_6c0;
            if ((_List_node_base *)local_438._0_8_ != (_List_node_base *)&local_428) {
              operator_delete((void *)local_438._0_8_,local_428 + 1);
              this = (torrent *)local_6f1._17_8_;
              ppVar41 = local_6c0;
            }
          }
          this_02 = (uchar  [8])local_6a8._8_8_;
        }
        if (this_02 != (uchar  [8])0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
        }
      }
LAB_00323b72:
      ppVar40 = ppVar40 + 1;
    } while (ppVar40 != ppVar41);
  }
  if (*(i2p_connection **)(local_6f1._9_8_ + 0x100) != (i2p_connection *)0x0) {
    ppVar40 = (pointer)(((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                          *)(local_6f1._1_8_ + 0x48))->
                       super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                       )._M_impl.super__Vector_impl_data._M_start;
    local_6c0 = (pointer)(((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                            *)(local_6f1._1_8_ + 0x48))->
                         super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar40 != local_6c0) {
      local_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
      do {
        get_peer_list_state((torrent_state *)local_580,this);
        stack0xfffffffffffffa30 = (unkuint9)0;
        p_Stack_5b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        uStack_5b0 = 0;
        local_5a8 = 0;
        s.m_len = (difference_type)ptVar33;
        s.m_ptr = &DAT_00000020;
        auStack_5f0._24_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(auStack_5f0 + 0x28);
        base32encode_i2p_abi_cxx11_(&local_5a0,(libtorrent *)ppVar40,s);
        ::std::__cxx11::string::append((char *)&local_5a0);
        _Var22._M_p = local_5a0._M_dataplus._M_p;
        piVar12 = *(i2p_connection **)(local_6f1._9_8_ + 0x100);
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_6b8,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_6d0);
        local_6f1._25_8_ = ppVar40;
        if (((piVar12->m_state == sam_idle) &&
            ((piVar12->m_name_lookup).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next ==
             (_List_node_base *)&piVar12->m_name_lookup)) &&
           ((peVar13 = (piVar12->m_sam_socket).
                       super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            , peVar13 != (element_type *)0x0 &&
            ((peVar13->super_proxy_base).m_sock.
             super_noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             .
             super_basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.implementation_.super_base_implementation_type.socket_ != -1)))) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4a8,_Var22._M_p,&local_6c1);
          plVar23 = local_4a8[0];
          auVar42 = local_6b8;
          uVar36 = local_6b8._0_8_;
          uVar21 = local_6b8._8_8_;
          local_6b8 = (undefined1  [16])0x0;
          piVar12->m_state = sam_name_lookup;
          peVar13 = (piVar12->m_sam_socket).
                    super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pcVar32 = (char *)(peVar13->m_name_lookup)._M_string_length;
          strlen((char *)local_4a8[0]);
          ::std::__cxx11::string::_M_replace
                    ((ulong)&peVar13->m_name_lookup,0,pcVar32,(ulong)plVar23);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(piVar12->m_sam_socket).
                       super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          p_Var4 = (piVar12->m_sam_socket).
                   super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          local_4c8 = (piVar12->m_sam_socket).
                      super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_4b8 = auVar42;
          paVar10->_M_local_buf[0x169] = '\x04';
          local_4d0 = piVar12;
          uVar26 = snprintf(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_438)->_M_local_buf,0x400,"NAMING LOOKUP NAME=%s\n",
                            *(long *)(paVar10->_M_local_buf + 0x138));
          if (0x3ff < uVar26) {
            uVar26 = 0x400;
          }
          local_678._M_allocated_capacity = (size_type)uVar26;
          local_4c8._M_ptr = (element_type *)0x0;
          local_4c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4b8 = (undefined1  [16])0x0;
          auStack_5f0._8_16_ = (undefined1  [16])0x0;
          _local_5f8 = (undefined1  [16])0x0;
          local_678._8_8_ = 0;
          local_668 = local_668 & 0xffffffff00000000;
          local_628._8_8_ = 0;
          local_628._M_allocated_capacity = (size_type)piVar12;
          local_640 = uVar36;
          local_608 = 0;
          local_638 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar21;
          local_618 = ZEXT816(0);
          local_488.val_ = 0;
          local_488.failed_ = false;
          local_488.cat_ =
               &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
          ptVar33 = (tracker_response *)0x1;
          local_688._0_8_ = paVar10;
          local_688._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_438;
          local_660 = paVar10;
          local_658 = piVar12;
          local_650 = paVar10;
          local_648 = p_Var4;
          local_630 = paVar10;
          local_600 = piVar12;
          boost::asio::detail::
          write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>_>_>
          ::operator()((write_op<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::asio::mutable_buffer,_const_boost::asio::mutable_buffer_*,_boost::asio::detail::transfer_all_t,_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:151:4),_libtorrent::aux::wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3647:8)>_>_>
                        *)&local_688,&local_488,0,1);
          ppVar40 = (pointer)local_6f1._25_8_;
          this = (torrent *)local_6f1._17_8_;
          if (local_638 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_638);
          }
          if (local_648 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_648);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_5f0._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_5f0._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_5f0._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_5f0._0_8_);
          }
          if (local_4a8[0] != local_498) {
            operator_delete(local_4a8[0],local_498[0] + 1);
          }
        }
        else {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,_Var22._M_p,(allocator<char> *)local_688.__u6_addr8);
          p_Var28 = (_List_node_base *)operator_new(0x50);
          p_Var28[1]._M_next = p_Var28 + 2;
          if ((_List_node_base *)local_438._0_8_ == (_List_node_base *)&local_428) {
            p_Var28[2]._M_next = (_List_node_base *)local_428;
            p_Var28[2]._M_prev = (_List_node_base *)apsStack_420[0];
          }
          else {
            p_Var28[1]._M_next = (_List_node_base *)local_438._0_8_;
            p_Var28[2]._M_next = (_List_node_base *)local_428;
          }
          p_Var28[1]._M_prev = (_List_node_base *)local_438._8_8_;
          stack0xfffffffffffffbd0 = ZEXT89(0);
          p_Var28[4]._M_next = (_List_node_base *)0x0;
          p_Var28[4]._M_prev = (_List_node_base *)0x0;
          p_Var28[3]._M_next = (_List_node_base *)0x0;
          p_Var28[3]._M_prev = (_List_node_base *)0x0;
          local_438._0_8_ = (_List_node_base *)&local_428;
          p_Var29 = (_List_node_base *)operator_new(0x10);
          p_Var29->_M_next = (_List_node_base *)local_6b8._0_8_;
          p_Var29->_M_prev = (_List_node_base *)0x0;
          ptVar33 = (tracker_response *)local_6b8._8_8_;
          p_Var29->_M_prev = (_List_node_base *)local_6b8._8_8_;
          local_6b8 = ZEXT816(0);
          p_Var28[3]._M_next = p_Var29;
          p_Var28[4]._M_prev =
               (_List_node_base *)
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
               ::_M_invoke;
          p_Var28[4]._M_next =
               (_List_node_base *)
               ::std::
               _Function_handler<void_(const_boost::system::error_code_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3647:8)>
               ::_M_manager;
          ::std::__detail::_List_node_base::_M_hook(p_Var28);
          psVar2 = &(piVar12->m_name_lookup).
                    super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar2 = *psVar2 + 1;
          this = (torrent *)local_6f1._17_8_;
          ppVar40 = (pointer)local_6f1._25_8_;
          if ((_List_node_base *)local_438._0_8_ != (_List_node_base *)&local_428) {
            operator_delete((void *)local_438._0_8_,local_428 + 1);
            this = (torrent *)local_6f1._17_8_;
            ppVar40 = (pointer)local_6f1._25_8_;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6b8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_5f0._24_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_5f0 + 0x28)) {
          operator_delete((void *)auStack_5f0._24_8_,aStack_5c8._0_8_ + 1);
        }
        if (local_4e8 != (pointer)0x0) {
          operator_delete(local_4e8,(long)local_4d8 - (long)local_4e8);
        }
        ppVar40 = (pointer)&ppVar40->pid;
      } while (ppVar40 != local_6c0);
    }
  }
  uVar36 = local_6f1._17_8_;
  flags.m_val = (local_6f1[0] == V2) << 7;
  piVar37 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
               *)(local_6f1._1_8_ + 0x18))->
            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  piVar14 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
               *)(local_6f1._1_8_ + 0x18))->
            super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar24 = false;
  if (piVar37 != piVar14) {
    do {
      local_438._0_8_ = (ulong)*(uint *)(piVar37->ip)._M_elems << 0x20;
      stack0xfffffffffffffbd0 = (undefined1  [16])0x0;
      apsStack_420[0] = (system_error_category *)0x0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)local_580,(address *)local_438,
                 *(unsigned_short *)(&piVar37->ip + 1));
      ptVar30 = add_peer((torrent *)uVar36,(basic_endpoint<boost::asio::ip::tcp> *)local_580,
                         (peer_source_flags_t)0x1,flags);
      bVar24 = (bool)(bVar24 | ptVar30 != (torrent_peer *)0x0);
      piVar37 = (pointer)((long)(&piVar37->ip + 1) + 2);
    } while (piVar37 != piVar14);
  }
  this_01 = (torrent *)local_6f1._17_8_;
  piVar38 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               *)(local_6f1._1_8_ + 0x30))->
            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_start;
  piVar15 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
               *)(local_6f1._1_8_ + 0x30))->
            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (piVar38 != piVar15) {
    do {
      local_688._0_8_ = *(undefined8 *)(piVar38->ip)._M_elems;
      local_688._8_8_ = *(undefined8 *)((piVar38->ip)._M_elems + 8);
      unique0x10000ec7 = *(undefined1 (*) [16])(piVar38->ip)._M_elems;
      local_438._0_8_ = (_List_node_base *)0x1;
      apsStack_420[0] = (system_error_category *)0x0;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                ((basic_endpoint<boost::asio::ip::tcp> *)local_580,(address *)local_438,
                 piVar38->port);
      ptVar30 = add_peer(this_01,(basic_endpoint<boost::asio::ip::tcp> *)local_580,
                         (peer_source_flags_t)0x1,flags);
      bVar24 = (bool)(bVar24 | ptVar30 != (torrent_peer *)0x0);
      piVar38 = piVar38 + 1;
    } while (piVar38 != piVar15);
  }
  iVar25 = (*(this_01->super_request_callback)._vptr_request_callback[6])(this_01);
  if ((char)iVar25 != '\0') {
    piVar37 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar14 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((piVar37 != piVar14) ||
       ((((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           *)(local_6f1._1_8_ + 0x30))->
        super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
           *)(local_6f1._1_8_ + 0x30))->
        super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      local_580._8_8_ = 0;
      local_580._0_8_ = local_570;
      local_570._0_8_ = local_570._0_8_ & 0xffffffffffffff00;
      if (piVar37 != piVar14) {
        puVar31 = (uint *)__errno_location();
        local_6f1._25_8_ = (pointer)0x100000016;
        do {
          local_630 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_630._4_4_,*(undefined4 *)(piVar37->ip)._M_elems);
          *puVar31 = 0;
          pcVar32 = inet_ntop(2,&local_630,auStack_5f0 + 0x18,0x10);
          uVar34 = (ulong)*puVar31;
          uVar39 = 0x100000000;
          if (uVar34 == 0) {
            uVar39 = 0;
          }
          ppVar40 = (pointer)local_6f1._25_8_;
          if (uVar34 != 0) {
            ppVar40 = (pointer)(uVar39 | uVar34);
          }
          if ((pcVar32 == (char *)0x0) && ((ulong)ppVar40 >> 0x20 != 0)) {
            ::std::runtime_error::runtime_error((runtime_error *)local_438,"");
            apsStack_420[1] = (system_error_category *)local_408;
            local_438._0_8_ = &PTR__system_error_004ee4b8;
            local_428 = ppVar40;
            apsStack_420[0] = &boost::system::detail::cat_holder<void>::system_category_instance;
            local_410 = (pointer)0x0;
            local_408[0]._M_local_buf[0] = ipv4;
            boost::throw_exception<boost::system::system_error>((system_error *)local_438);
          }
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_688.__u6_addr8,pcVar32,(allocator<char> *)local_438);
          ::std::__cxx11::string::_M_append(local_580,local_688._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688._0_8_ != &local_678) {
            operator_delete((void *)local_688._0_8_,local_678._M_allocated_capacity + 1);
          }
          ::std::__cxx11::string::push_back((char)local_580);
          piVar37 = (pointer)((long)(&piVar37->ip + 1) + 2);
        } while (piVar37 != piVar14);
      }
      piVar38 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                   *)(local_6f1._1_8_ + 0x30))->
                super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                )._M_impl.super__Vector_impl_data._M_start;
      piVar15 = (((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                   *)(local_6f1._1_8_ + 0x30))->
                super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (piVar38 != piVar15) {
        do {
          local_678._M_allocated_capacity = 0;
          local_688._0_8_ = *(undefined8 *)(piVar38->ip)._M_elems;
          local_688._8_8_ = *(undefined8 *)((piVar38->ip)._M_elems + 8);
          boost::asio::ip::address_v6::to_string_abi_cxx11_
                    ((string *)local_438,(address_v6 *)&local_688);
          ::std::__cxx11::string::_M_append(local_580,local_438._0_8_);
          if ((_List_node_base *)local_438._0_8_ != (_List_node_base *)&local_428) {
            operator_delete((void *)local_438._0_8_,local_428 + 1);
          }
          ::std::__cxx11::string::push_back((char)local_580);
          piVar38 = piVar38 + 1;
        } while (piVar38 != piVar15);
      }
      this_01 = (torrent *)local_6f1._17_8_;
      ppVar16 = (((torrent_hot_members *)(local_6f1._17_8_ + 8))->m_peer_list)._M_t.
                super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
      if (ppVar16 == (peer_list *)0x0) {
        uVar39 = 0xffffffff;
      }
      else {
        uVar39 = (ulong)(uint)ppVar16->m_num_connect_candidates;
      }
      (*((request_callback *)local_6f1._17_8_)->_vptr_request_callback[7])
                (local_6f1._17_8_,"tracker add_peer() [ %s] connect-candidates: %d",local_580._0_8_,
                 uVar39);
      if ((undefined1 *)local_580._0_8_ != local_570) {
        operator_delete((void *)local_580._0_8_,local_570._0_8_ + 1);
      }
    }
  }
  if (bVar24) {
    state_updated(this_01);
  }
  update_want_peers(this_01);
  iVar25 = (*(((this_01->super_torrent_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger[5])();
  uVar36 = local_6f1._1_8_;
  if (((*(uint *)(CONCAT44(extraout_var_02,iVar25) + 0x68) & 0x10) != 0) ||
     (*(bool *)(local_6f1._9_8_ + 0xf1) == true)) {
    ppVar40 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *
                )local_6f1._1_8_)->
              super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    piVar37 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    ppVar41 = (((vector<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_> *
                )local_6f1._1_8_)->
              super__Vector_base<libtorrent::aux::peer_entry,_std::allocator<libtorrent::aux::peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar14 = (((vector<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x18))->
              super__Vector_base<libtorrent::aux::ipv4_peer_entry,_std::allocator<libtorrent::aux::ipv4_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    piVar17 = (((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x48))->
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    piVar18 = (((vector<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
                 *)(local_6f1._1_8_ + 0x48))->
              super__Vector_base<libtorrent::aux::i2p_peer_entry,_std::allocator<libtorrent::aux::i2p_peer_entry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar25 = (*(((this_01->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_438);
    local_580._0_4_ =
         (int)((ulong)((long)(((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                                *)(uVar36 + 0x30))->
                             super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(((vector<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                               *)(uVar36 + 0x30))->
                            super__Vector_base<libtorrent::aux::ipv6_peer_entry,_std::allocator<libtorrent::aux::ipv6_peer_entry>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 1) * 0x38e38e39 +
         (int)((ulong)((long)piVar17 - (long)piVar18) >> 5) +
         (int)((ulong)((long)piVar37 - (long)piVar14) >> 1) * -0x55555555 +
         (int)((ulong)((long)ppVar40 - (long)ppVar41) >> 3) * -0x49249249;
    alert_manager::
    emplace_alert<libtorrent::tracker_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int,libtorrent::protocol_version_const&,std::__cxx11::string_const&>
              ((alert_manager *)CONCAT44(extraout_var_03,iVar25),(torrent_handle *)local_438,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_478.base,(int *)local_580,local_6f1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f1._9_8_)
    ;
    if ((long *)local_438._8_8_ != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(local_438._8_8_ + 0xc);
        iVar25 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar25 = *(int *)(local_438._8_8_ + 0xc);
        *(int *)(local_438._8_8_ + 0xc) = iVar25 + -1;
      }
      if (iVar25 == 1) {
        (**(code **)(*(long *)local_438._8_8_ + 0x18))();
      }
    }
  }
  do_connect_boost(this_01);
  state_updated(this_01);
  return;
}

Assistant:

void torrent::tracker_response(
		tracker_request const& r
		, address const& tracker_ip // this is the IP we connected to
		, std::list<address> const& tracker_ips // these are all the IPs it resolved to
		, struct tracker_response const& resp)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(!(r.kind & tracker_request::scrape_request));

		// if the tracker told us what our external IP address is, record it with
		// out external IP counter (and pass along the IP of the tracker to know
		// who to attribute this vote to)
		if (resp.external_ip != address() && !tracker_ip.is_unspecified() && r.outgoing_socket)
			m_ses.set_external_address(r.outgoing_socket.get_local_endpoint()
				, resp.external_ip
				, aux::session_interface::source_tracker, tracker_ip);

		time_point32 const now = aux::time_now32();

		protocol_version const v = r.info_hash == torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		// TODO: move this into a function on tracker_list
		aux::announce_entry* ae = m_trackers.find_tracker(r.url);

		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(r.outgoing_socket);
			if (aep)
			{
				auto& a = aep->info_hashes[v];

				local_endpoint = aep->local_endpoint;
				if (resp.incomplete >= 0) a.scrape_incomplete = resp.incomplete;
				if (resp.complete >= 0) a.scrape_complete = resp.complete;
				if (resp.downloaded >= 0) a.scrape_downloaded = resp.downloaded;
				if (!a.start_sent && r.event == event_t::started)
					a.start_sent = true;
				if (!a.complete_sent && r.event == event_t::completed)
				{
					a.complete_sent = true;
					// we successfully reported event=completed to one tracker. Don't
					// send it to any other ones from now on (there may be other
					// announces outstanding right now though)
					m_complete_sent = true;
				}
				ae->verified = true;
				a.next_announce = now + resp.interval;
				a.min_announce = now + resp.min_interval;
				a.updating = false;
				a.fails = 0;
				a.last_error.clear();
				a.message = !resp.warning_message.empty() ? resp.warning_message : std::string();
				m_trackers.record_working(ae);

				if ((!resp.trackerid.empty()) && (ae->trackerid != resp.trackerid))
				{
					ae->trackerid = resp.trackerid;
					if (m_ses.alerts().should_post<trackerid_alert>())
						m_ses.alerts().emplace_alert<trackerid_alert>(get_handle()
							, aep->local_endpoint, v, r.url, resp.trackerid);
				}

				update_scrape_state();
			}
		}
		update_tracker_timer(now);

#if TORRENT_ABI_VERSION == 1
		if (resp.complete >= 0 && resp.incomplete >= 0)
			m_last_scrape = aux::time_now32();
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			std::string resolved_to;
			for (auto const& i : tracker_ips)
			{
				resolved_to += i.to_string();
				resolved_to += ", ";
			}
			debug_log("TRACKER RESPONSE [ interval: %d | min-interval: %d | "
				"external ip: %s | resolved to: %s | we connected to: %s ]"
				, resp.interval.count()
				, resp.min_interval.count()
				, print_address(resp.external_ip).c_str()
				, resolved_to.c_str()
				, print_address(tracker_ip).c_str());
		}
#else
		TORRENT_UNUSED(tracker_ips);
#endif

		// for each of the peers we got from the tracker
		for (auto const& i : resp.peers)
		{
			// don't make connections to ourself
			if (i.pid == m_peer_id)
				continue;

#if TORRENT_USE_I2P
			if (r.i2pconn)
			{
				// this is an i2p name, we need to use the SAM connection
				// to do the name lookup
				if (string_ends_with(i.hostname, ".i2p"))
				{
					ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
					r.i2pconn->async_name_lookup(i.hostname.c_str()
						, [self = shared_from_this()] (error_code const& ec, char const* dest)
						{ self->torrent::on_i2p_resolve(ec, dest); });
				}
				else
				{
					torrent_state st = get_peer_list_state();
					need_peer_list();
					if (m_peer_list->add_i2p_peer(i.hostname, peer_info::tracker, {}, &st))
						state_updated();
					peers_erased(st.erased);
				}
			}
			else
#endif
			{
				ADD_OUTSTANDING_ASYNC("torrent::on_peer_name_lookup");
				m_ses.get_resolver().async_resolve(i.hostname, aux::resolver_interface::abort_on_shutdown
					, std::bind(&torrent::on_peer_name_lookup, shared_from_this(), _1, _2, i.port, v));
			}
		}

#if TORRENT_USE_I2P
		if (r.i2pconn)
		{
			for (auto const& i : resp.i2p_peers)
			{
				torrent_state st = get_peer_list_state();
				peer_entry p;
				std::string destination = base32encode_i2p(i.destination);
				destination += ".b32.i2p";

				ADD_OUTSTANDING_ASYNC("torrent::on_i2p_resolve");
				r.i2pconn->async_name_lookup(destination.c_str()
					, [self = shared_from_this()] (error_code const& ec, char const* dest)
					{ self->torrent::on_i2p_resolve(ec, dest); });
			}
		}
#endif

		// there are 2 reasons to allow local IPs to be returned from a
		// non-local tracker
		// 1. retrackers are popular in russia, where an ISP runs a tracker within
		//    the AS (but not on the local network) giving out peers only from the
		//    local network
		// 2. it might make sense to have a tracker extension in the future where
		//    trackers records a peer's internal and external IP, and match up
		//    peers on the same local network

		pex_flags_t flags = v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0);

		bool need_update = false;
		for (auto const& i : resp.peers4)
		{
			tcp::endpoint const a(address_v4(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

		for (auto const& i : resp.peers6)
		{
			tcp::endpoint const a(address_v6(i.ip), i.port);
			need_update |= bool(add_peer(a, peer_info::tracker, flags) != nullptr);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && (!resp.peers4.empty() || !resp.peers6.empty()))
		{
			std::string str;
			for (auto const& peer : resp.peers4)
			{
				str += address_v4(peer.ip).to_string();
				str += ' ';
			}
			for (auto const& peer : resp.peers6)
			{
				str += address_v6(peer.ip).to_string();
				str += ' ';
			}
			debug_log("tracker add_peer() [ %s] connect-candidates: %d"
				, str.c_str(), m_peer_list
				? m_peer_list->num_connect_candidates() : -1);
		}
#endif
		if (need_update) state_updated();

		update_want_peers();

		// post unconditionally if the announce was triggered manually
		if (m_ses.alerts().should_post<tracker_reply_alert>()
			|| r.triggered_manually)
		{
			int peer_count = int(resp.peers.size() + resp.peers4.size());
#if TORRENT_USE_I2P
			peer_count += int(resp.i2p_peers.size());
#endif
			m_ses.alerts().emplace_alert<tracker_reply_alert>(
				get_handle(), local_endpoint, peer_count
				+ int(resp.peers6.size()), v, r.url);
		}

		do_connect_boost();

		state_updated();
	}